

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IdlFbInterfaces.h
# Opt level: O2

void __thiscall
Firebird::
IStatusBaseImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::IDisposableImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IVersionedImpl<Firebird::ThrowStatusWrapper,_Firebird::ThrowStatusWrapper,_Firebird::Inherit<Firebird::IStatus>_>_>_>_>
::IStatusBaseImpl::VTableImpl::VTableImpl(VTableImpl *this)

{
  (this->super_VTable).super_VTable.super_VTable.version = 3;
  (this->super_VTable).super_VTable.dispose = cloopdisposeDispatcher;
  (this->super_VTable).init = cloopinitDispatcher;
  (this->super_VTable).getState = cloopgetStateDispatcher;
  (this->super_VTable).setErrors2 = cloopsetErrors2Dispatcher;
  (this->super_VTable).setWarnings2 = cloopsetWarnings2Dispatcher;
  (this->super_VTable).setErrors = cloopsetErrorsDispatcher;
  (this->super_VTable).setWarnings = cloopsetWarningsDispatcher;
  (this->super_VTable).getErrors = cloopgetErrorsDispatcher;
  (this->super_VTable).getWarnings = cloopgetWarningsDispatcher;
  (this->super_VTable).clone = cloopcloneDispatcher;
  return;
}

Assistant:

VTableImpl()
				{
					this->version = Base::VERSION;
					this->dispose = &Name::cloopdisposeDispatcher;
					this->init = &Name::cloopinitDispatcher;
					this->getState = &Name::cloopgetStateDispatcher;
					this->setErrors2 = &Name::cloopsetErrors2Dispatcher;
					this->setWarnings2 = &Name::cloopsetWarnings2Dispatcher;
					this->setErrors = &Name::cloopsetErrorsDispatcher;
					this->setWarnings = &Name::cloopsetWarningsDispatcher;
					this->getErrors = &Name::cloopgetErrorsDispatcher;
					this->getWarnings = &Name::cloopgetWarningsDispatcher;
					this->clone = &Name::cloopcloneDispatcher;
				}